

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O2

CTSize lj_ctype_vlsize(CTState *cts,CType *ct,CTSize nelem)

{
  ushort uVar1;
  CType *pCVar2;
  ulong uVar3;
  uint uVar4;
  CTInfo CVar5;
  
  CVar5 = ct->info;
  if ((CVar5 & 0xf0000000) == 0x10000000) {
    uVar3 = (ulong)ct->size;
    pCVar2 = cts->tab;
    uVar4 = 0;
    while (uVar1 = ct->sib, uVar1 != 0) {
      ct = pCVar2 + uVar1;
      if ((pCVar2[uVar1].info & 0xf0000000) == 0x90000000) {
        uVar4 = pCVar2[uVar1].info & 0xffff;
      }
    }
    CVar5 = pCVar2[uVar4].info;
  }
  else {
    pCVar2 = cts->tab;
    uVar3 = 0;
  }
  uVar3 = (ulong)nelem * (ulong)*(uint *)((long)&pCVar2->size + (ulong)((CVar5 & 0xffff) << 4)) +
          uVar3;
  return -(uint)(uVar3 >> 0x1f != 0) | (uint)uVar3;
}

Assistant:

CTSize lj_ctype_vlsize(CTState *cts, CType *ct, CTSize nelem)
{
  uint64_t xsz = 0;
  if (ctype_isstruct(ct->info)) {
    CTypeID arrid = 0, fid = ct->sib;
    xsz = ct->size;  /* Add the struct size. */
    while (fid) {
      CType *ctf = ctype_get(cts, fid);
      if (ctype_type(ctf->info) == CT_FIELD)
	arrid = ctype_cid(ctf->info);  /* Remember last field of VLS. */
      fid = ctf->sib;
    }
    ct = ctype_raw(cts, arrid);
  }
  lj_assertCTS(ctype_isvlarray(ct->info), "VLA expected");
  ct = ctype_rawchild(cts, ct);  /* Get array element. */
  lj_assertCTS(ctype_hassize(ct->info), "bad VLA without size");
  /* Calculate actual size of VLA and check for overflow. */
  xsz += (uint64_t)ct->size * nelem;
  return xsz < 0x80000000u ? (CTSize)xsz : CTSIZE_INVALID;
}